

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::setFrameVelocityRepresentation
          (KinDynComputations *this,FrameVelocityRepresentation frameVelRepr)

{
  int in_ESI;
  long in_RDI;
  bool local_1;
  
  if (((in_ESI == 0) || (in_ESI == 1)) || (in_ESI == 2)) {
    if (in_ESI != *(int *)(*(long *)(in_RDI + 8) + 4)) {
      *(undefined1 *)(*(long *)(in_RDI + 8) + 0x430) = 0;
    }
    *(int *)(*(long *)(in_RDI + 8) + 4) = in_ESI;
    local_1 = true;
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","setFrameVelocityRepresentation",
               "unknown frame velocity representation");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool KinDynComputations::setFrameVelocityRepresentation(const FrameVelocityRepresentation frameVelRepr) const
{
    if( frameVelRepr != INERTIAL_FIXED_REPRESENTATION &&
        frameVelRepr != BODY_FIXED_REPRESENTATION &&
        frameVelRepr != MIXED_REPRESENTATION )
    {
        reportError("KinDynComputations","setFrameVelocityRepresentation","unknown frame velocity representation");
        return false;
    }

    // If there is a change in FrameVelocityRepresentation, we should also invalidate the bias acceleration cache, as
    // the bias acceleration depends on the frameVelRepr even if it is always expressed in body fixed representation.
    // All the other cache are fine because they are always stored in BODY_FIXED, and they do not depend on the frameVelRepr,
    // as they are converted on the fly when the relative retrieval method is called.
    if (frameVelRepr != pimpl->m_frameVelRepr)
    {
        this->pimpl->m_areBiasAccelerationsUpdated = false;
    }

    pimpl->m_frameVelRepr = frameVelRepr;
    return true;
}